

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  bool bVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  uint a;
  int iVar8;
  long lVar9;
  ulong uVar10;
  float *output;
  stbi_uc *psVar11;
  char *pcVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  int req_comp_00;
  stbi_uc *extraout_RDX;
  stbi_uc *psVar15;
  stbi_uc *extraout_RDX_00;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint b;
  uint uVar19;
  long *in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  stbi_uc *local_4b8;
  ulong local_498;
  stbi_uc *local_490;
  long local_488;
  char *local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  uVar10 = (ulong)(uint)req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar3 = false;
      do {
        auVar20[0] = -(cStack_431 == '3');
        auVar20[1] = -(cStack_430 == '2');
        auVar20[2] = -(cStack_42f == '-');
        auVar20[3] = -(cStack_42e == 'b');
        auVar20[4] = -(cStack_42d == 'i');
        auVar20[5] = -(cStack_42c == 't');
        auVar20[6] = -(cStack_42b == '_');
        auVar20[7] = -(cStack_42a == 'r');
        auVar20[8] = -(cStack_429 == 'l');
        auVar20[9] = -(cStack_428 == 'e');
        auVar20[10] = -(cStack_427 == '_');
        auVar20[0xb] = -(cStack_426 == 'r');
        auVar20[0xc] = -(cStack_425 == 'g');
        auVar20[0xd] = -(cStack_424 == 'b');
        auVar20[0xe] = -(cStack_423 == 'e');
        auVar20[0xf] = -(cStack_422 == '\0');
        auVar21[0] = -(local_438 == 'F');
        auVar21[1] = -(cStack_437 == 'O');
        auVar21[2] = -(cStack_436 == 'R');
        auVar21[3] = -(cStack_435 == 'M');
        auVar21[4] = -(cStack_434 == 'A');
        auVar21[5] = -(cStack_433 == 'T');
        auVar21[6] = -(cStack_432 == '=');
        auVar21[7] = -(cStack_431 == '3');
        auVar21[8] = -(cStack_430 == '2');
        auVar21[9] = -(cStack_42f == '-');
        auVar21[10] = -(cStack_42e == 'b');
        auVar21[0xb] = -(cStack_42d == 'i');
        auVar21[0xc] = -(cStack_42c == 't');
        auVar21[0xd] = -(cStack_42b == '_');
        auVar21[0xe] = -(cStack_42a == 'r');
        auVar21[0xf] = -(cStack_429 == 'l');
        auVar21 = auVar21 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
          bVar3 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
        iVar16 = (int)uVar10;
      } while (local_438 != '\0');
      if (bVar3) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_448 = &cStack_435;
          lVar9 = strtol(local_448,&local_448,10);
          local_448 = local_448 + 2;
          do {
            pcVar12 = local_448;
            local_448 = pcVar12 + 1;
          } while (pcVar12[-2] == ' ');
          if (((pcVar12[-2] == '+') && (pcVar12[-1] == 'X')) && (*pcVar12 == ' ')) {
            uVar10 = strtol(local_448,(char **)0x0,10);
            b = (uint)lVar9;
            if (((int)b < 0x1000001) && (a = (uint)uVar10, (int)a < 0x1000001)) {
              *x = a;
              *y = b;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              iVar8 = stbi__mad4sizes_valid(a,b,4,4,iVar16);
              if (iVar8 != 0) {
                output = (float *)stbi__malloc_mad4(a,b,4,4,iVar16);
                if (output == (float *)0x0) {
LAB_0044080a:
                  lVar9 = *in_FS_OFFSET;
                  pcVar12 = "outofmem";
                }
                else {
                  iVar16 = 0;
                  if (a - 0x8000 < 0xffff8008) goto LAB_00440824;
                  if ((int)b < 1) {
                    return output;
                  }
                  psVar1 = s->buffer_start;
                  psVar2 = s->buffer_start + 1;
                  local_498 = 0;
                  uVar14 = 0;
                  local_4b8 = (stbi_uc *)0x0;
                  while( true ) {
                    sVar4 = stbi__get8(s);
                    sVar5 = stbi__get8(s);
                    sVar6 = stbi__get8(s);
                    if (((sVar4 != '\x02') || (sVar5 != '\x02')) || ((char)sVar6 < '\0')) {
                      local_440 = sVar4;
                      local_43f = sVar5;
                      local_43e = sVar6;
                      local_43d = stbi__get8(s);
                      stbi__hdr_convert(output,&local_440,req_comp_00);
                      free(local_4b8);
                      iVar16 = 0;
                      iVar8 = 1;
                      do {
                        stbi__getn(s,local_43c,4);
                        stbi__hdr_convert(output + (long)(int)(a * iVar16 * 4) + (long)(iVar8 * 4),
                                          local_43c,a);
                        iVar8 = iVar8 + 1;
                        while ((int)a <= iVar8) {
                          iVar16 = iVar16 + 1;
LAB_00440824:
                          iVar8 = 0;
                          if ((int)b <= iVar16) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    sVar4 = stbi__get8(s);
                    if (CONCAT11(sVar6,sVar4) != a) break;
                    if ((local_4b8 == (stbi_uc *)0x0) &&
                       (local_4b8 = (stbi_uc *)malloc(uVar10 * 4 & 0xffffffff),
                       local_4b8 == (stbi_uc *)0x0)) {
                      free(output);
                      goto LAB_0044080a;
                    }
                    local_488 = 0;
                    local_490 = local_4b8;
                    do {
                      iVar16 = 0;
                      uVar17 = uVar10;
                      do {
                        psVar15 = s->img_buffer;
                        psVar11 = s->img_buffer_end;
                        if (psVar11 <= psVar15) {
                          if (s->read_from_callbacks != 0) {
                            iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            s->callback_already_read =
                                 s->callback_already_read +
                                 (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                            if (iVar8 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              uVar19 = 0;
                              psVar11 = psVar2;
                            }
                            else {
                              uVar19 = (uint)*psVar1;
                              psVar11 = psVar1 + iVar8;
                            }
                            s->img_buffer_end = psVar11;
                            s->img_buffer = psVar2;
                            psVar13 = psVar2;
                            psVar15 = extraout_RDX;
                            goto LAB_004404f7;
                          }
LAB_0044077a:
                          free(output);
                          free(local_4b8);
                          lVar9 = *in_FS_OFFSET;
                          pcVar12 = "corrupt";
                          goto LAB_00440746;
                        }
                        s->img_buffer = psVar15 + 1;
                        uVar19 = (uint)*psVar15;
                        psVar13 = psVar15 + 1;
LAB_004404f7:
                        if ((byte)uVar19 < 0x81) {
                          if ((uVar19 == 0) || ((uint)uVar17 < uVar19)) goto LAB_0044077a;
                          lVar9 = 0;
                          do {
                            psVar11 = s->img_buffer;
                            if (psVar11 < s->img_buffer_end) {
                              s->img_buffer = psVar11 + 1;
                              sVar4 = *psVar11;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar4 = '\0';
                            }
                            else {
                              iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              s->callback_already_read =
                                   s->callback_already_read +
                                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                              if (iVar8 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar4 = '\0';
                                psVar15 = psVar2;
                              }
                              else {
                                sVar4 = *psVar1;
                                psVar15 = psVar1 + iVar8;
                              }
                              s->img_buffer_end = psVar15;
                              s->img_buffer = psVar2;
                              psVar15 = psVar2;
                            }
                            local_490[lVar9 * 4 + (long)iVar16 * 4] = sVar4;
                            lVar9 = lVar9 + 1;
                          } while (uVar19 != (uint)lVar9);
                          iVar16 = iVar16 + (uint)lVar9;
                        }
                        else {
                          if (psVar13 < psVar11) {
                            s->img_buffer = psVar13 + 1;
                            bVar7 = *psVar13;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar7 = 0;
                          }
                          else {
                            iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            s->callback_already_read =
                                 s->callback_already_read +
                                 (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                            if (iVar8 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar7 = 0;
                              psVar15 = psVar2;
                            }
                            else {
                              bVar7 = *psVar1;
                              psVar15 = psVar1 + iVar8;
                            }
                            s->img_buffer_end = psVar15;
                            s->img_buffer = psVar2;
                            psVar15 = psVar2;
                          }
                          if ((uint)uVar17 < (uVar19 & 0x7f)) goto LAB_0044077a;
                          if ((uVar19 & 0x7f) != 0) {
                            psVar15 = (stbi_uc *)0x0;
                            do {
                              local_490[(long)psVar15 * 4 + (long)iVar16 * 4] = bVar7;
                              psVar15 = psVar15 + 1;
                            } while ((uVar19 & 0x7f) != (uint)psVar15);
                            iVar16 = iVar16 + (uint)psVar15;
                          }
                        }
                        uVar17 = (ulong)(a - iVar16);
                      } while (a - iVar16 != 0 && iVar16 <= (int)a);
                      local_488 = local_488 + 1;
                      local_490 = local_490 + 1;
                      uVar17 = uVar10 & 0xffffffff;
                      uVar18 = local_498;
                      psVar11 = local_4b8;
                    } while (local_488 != 4);
                    do {
                      stbi__hdr_convert(output + (uVar18 & 0xffffffff),psVar11,(int)psVar15);
                      uVar17 = uVar17 - 1;
                      psVar15 = extraout_RDX_00;
                      uVar18 = uVar18 + 4;
                      psVar11 = psVar11 + 4;
                    } while (uVar17 != 0);
                    uVar14 = uVar14 + 1;
                    local_498 = local_498 + uVar10 * 4;
                    if (uVar14 == (b & 0x7fffffff)) {
                      free(local_4b8);
                      return output;
                    }
                  }
                  free(output);
                  free(local_4b8);
                  lVar9 = *in_FS_OFFSET;
                  pcVar12 = "invalid decoded scanline length";
                }
                goto LAB_00440746;
              }
            }
            lVar9 = *in_FS_OFFSET;
            pcVar12 = "too large";
            goto LAB_00440746;
          }
        }
        lVar9 = *in_FS_OFFSET;
        pcVar12 = "unsupported data layout";
        goto LAB_00440746;
      }
    }
    lVar9 = *in_FS_OFFSET;
    pcVar12 = "unsupported format";
  }
  else {
    lVar9 = *in_FS_OFFSET;
    pcVar12 = "not HDR";
  }
LAB_00440746:
  *(char **)(lVar9 + -8) = pcVar12;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}